

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

string * __thiscall
kws::Parser::FindNextWord_abi_cxx11_(string *__return_storage_ptr__,Parser *this,size_t pos)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  
  do {
    uVar3 = pos;
    pos = uVar3 + 1;
    if ((this->m_BufferNoComment)._M_dataplus._M_p[uVar3] == ' ') break;
  } while (uVar3 < (this->m_BufferNoComment)._M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (uVar3 < (this->m_BufferNoComment)._M_string_length) {
    bVar4 = true;
    bVar2 = false;
    do {
      cVar1 = (this->m_BufferNoComment)._M_dataplus._M_p[pos - 1];
      if ((cVar1 == '\r') || (cVar1 == ' ')) {
        if (bVar2) {
          bVar4 = false;
        }
      }
      else {
        bVar4 = true;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        bVar2 = true;
      }
    } while ((pos < (this->m_BufferNoComment)._M_string_length) && (pos = pos + 1, bVar4));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindNextWord(size_t pos) const
{
  size_t i=pos;

  // we go to the next space
  while(m_BufferNoComment[i] != ' ' && i<m_BufferNoComment.size())
    {
    i++;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i<m_BufferNoComment.size() && inWord)
    {
    if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\r')
      {
      ivar += m_BufferNoComment[i];
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(first)
        {
        inWord = false;
        }
      }
    i++;
    }
  return ivar;
}